

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

double util::rpn_eval_mod(vector<double,_std::allocator<double>_> *args)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *args_local;
  
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](args,0);
  iVar1 = d2i(*pvVar3);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](args,1);
  iVar2 = d2i(*pvVar3);
  return (double)(iVar1 % iVar2);
}

Assistant:

static double rpn_eval_mod(std::vector<double> args)   { return d2i(args[0]) % d2i(args[1]); }